

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool InputTextFilterCharacter
               (uint *p_char,ImGuiInputTextFlags flags,ImGuiInputTextCallback callback,
               void *user_data)

{
  bool bVar1;
  int iVar2;
  undefined1 local_80 [8];
  ImGuiInputTextCallbackData callback_data;
  uint c_decimal_point;
  ImGuiContext *g;
  bool pass;
  uint c;
  void *user_data_local;
  ImGuiInputTextCallback callback_local;
  ImGuiInputTextFlags flags_local;
  uint *p_char_local;
  
  g._4_4_ = *p_char;
  if ((g._4_4_ < 0x20) &&
     ((g._4_4_ != 10 || (flags & 0x100000U) == 0) && (g._4_4_ != 9 || (flags & 0x400U) == 0))) {
    p_char_local._7_1_ = false;
  }
  else if (g._4_4_ == 0x7f) {
    p_char_local._7_1_ = false;
  }
  else if ((g._4_4_ < 0xe000) || (0xf8ff < g._4_4_)) {
    if (g._4_4_ < 0x10000) {
      if ((flags & 0x2000fU) != 0) {
        callback_data.SelectionEnd = (int)GImGui->PlatformLocaleDecimalPoint;
        if ((((flags & 1U) != 0) &&
            (((g._4_4_ < 0x30 || (0x39 < g._4_4_)) && (g._4_4_ != callback_data.SelectionEnd)))) &&
           ((((g._4_4_ != 0x2d && (g._4_4_ != 0x2b)) && (g._4_4_ != 0x2a)) && (g._4_4_ != 0x2f)))) {
          return false;
        }
        if ((((flags & 0x20000U) != 0) && ((g._4_4_ < 0x30 || (0x39 < g._4_4_)))) &&
           ((g._4_4_ != callback_data.SelectionEnd &&
            (((((g._4_4_ != 0x2d && (g._4_4_ != 0x2b)) && (g._4_4_ != 0x2a)) &&
              ((g._4_4_ != 0x2f && (g._4_4_ != 0x65)))) && (g._4_4_ != 0x45)))))) {
          return false;
        }
        if (((((flags & 2U) != 0) && ((g._4_4_ < 0x30 || (0x39 < g._4_4_)))) &&
            ((g._4_4_ < 0x61 || (0x66 < g._4_4_)))) && ((g._4_4_ < 0x41 || (0x46 < g._4_4_)))) {
          return false;
        }
        if ((((flags & 4U) != 0) && (0x60 < g._4_4_)) && (g._4_4_ < 0x7b)) {
          g._4_4_ = g._4_4_ - 0x20;
          *p_char = g._4_4_;
        }
        if (((flags & 8U) != 0) && (bVar1 = ImCharIsBlankW(g._4_4_), bVar1)) {
          return false;
        }
      }
      if ((flags & 0x200U) != 0) {
        ImGuiInputTextCallbackData::ImGuiInputTextCallbackData
                  ((ImGuiInputTextCallbackData *)local_80);
        memset(local_80,0,0x38);
        local_80._0_4_ = 0x200;
        callback_data.UserData._0_2_ = (ushort)g._4_4_;
        local_80._4_4_ = flags;
        callback_data._0_8_ = user_data;
        iVar2 = (*callback)((ImGuiInputTextCallbackData *)local_80);
        if (iVar2 != 0) {
          return false;
        }
        *p_char = (uint)(ushort)callback_data.UserData;
        if ((ushort)callback_data.UserData == 0) {
          return false;
        }
      }
      p_char_local._7_1_ = true;
    }
    else {
      p_char_local._7_1_ = false;
    }
  }
  else {
    p_char_local._7_1_ = false;
  }
  return p_char_local._7_1_;
}

Assistant:

static bool InputTextFilterCharacter(unsigned int* p_char, ImGuiInputTextFlags flags, ImGuiInputTextCallback callback, void* user_data)
{
    unsigned int c = *p_char;

    // Filter non-printable (NB: isprint is unreliable! see #2467)
    if (c < 0x20)
    {
        bool pass = false;
        pass |= (c == '\n' && (flags & ImGuiInputTextFlags_Multiline));
        pass |= (c == '\t' && (flags & ImGuiInputTextFlags_AllowTabInput));
        if (!pass)
            return false;
    }

    // We ignore Ascii representation of delete (emitted from Backspace on OSX, see #2578, #2817)
    if (c == 127)
        return false;

    // Filter private Unicode range. GLFW on OSX seems to send private characters for special keys like arrow keys (FIXME)
    if (c >= 0xE000 && c <= 0xF8FF)
        return false;

    // Filter Unicode ranges we are not handling in this build.
    if (c > IM_UNICODE_CODEPOINT_MAX)
        return false;

    // Generic named filters
    if (flags & (ImGuiInputTextFlags_CharsDecimal | ImGuiInputTextFlags_CharsHexadecimal | ImGuiInputTextFlags_CharsUppercase | ImGuiInputTextFlags_CharsNoBlank | ImGuiInputTextFlags_CharsScientific))
    {
        // The libc allows overriding locale, with e.g. 'setlocale(LC_NUMERIC, "de_DE.UTF-8");' which affect the output/input of printf/scanf.
        // The standard mandate that programs starts in the "C" locale where the decimal point is '.'.
        // We don't really intend to provide widespread support for it, but out of empathy for people stuck with using odd API, we support the bare minimum aka overriding the decimal point.
        // Change the default decimal_point with:
        //   ImGui::GetCurrentContext()->PlatformLocaleDecimalPoint = *localeconv()->decimal_point;
        ImGuiContext& g = *GImGui;
        const unsigned c_decimal_point = (unsigned int)g.PlatformLocaleDecimalPoint;

        // Allow 0-9 . - + * /
        if (flags & ImGuiInputTextFlags_CharsDecimal)
            if (!(c >= '0' && c <= '9') && (c != c_decimal_point) && (c != '-') && (c != '+') && (c != '*') && (c != '/'))
                return false;

        // Allow 0-9 . - + * / e E
        if (flags & ImGuiInputTextFlags_CharsScientific)
            if (!(c >= '0' && c <= '9') && (c != c_decimal_point) && (c != '-') && (c != '+') && (c != '*') && (c != '/') && (c != 'e') && (c != 'E'))
                return false;

        // Allow 0-9 a-F A-F
        if (flags & ImGuiInputTextFlags_CharsHexadecimal)
            if (!(c >= '0' && c <= '9') && !(c >= 'a' && c <= 'f') && !(c >= 'A' && c <= 'F'))
                return false;

        // Turn a-z into A-Z
        if (flags & ImGuiInputTextFlags_CharsUppercase)
            if (c >= 'a' && c <= 'z')
                *p_char = (c += (unsigned int)('A' - 'a'));

        if (flags & ImGuiInputTextFlags_CharsNoBlank)
            if (ImCharIsBlankW(c))
                return false;
    }

    // Custom callback filter
    if (flags & ImGuiInputTextFlags_CallbackCharFilter)
    {
        ImGuiInputTextCallbackData callback_data;
        memset(&callback_data, 0, sizeof(ImGuiInputTextCallbackData));
        callback_data.EventFlag = ImGuiInputTextFlags_CallbackCharFilter;
        callback_data.EventChar = (ImWchar)c;
        callback_data.Flags = flags;
        callback_data.UserData = user_data;
        if (callback(&callback_data) != 0)
            return false;
        *p_char = callback_data.EventChar;
        if (!callback_data.EventChar)
            return false;
    }

    return true;
}